

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleToUpperLowerCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool toUpper)

{
  pointer pbVar1;
  ulong uVar2;
  string output;
  string local_60;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar2 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"no output variable specified",(allocator<char> *)&local_40);
    cmCommand::SetError(&this->super_cmCommand,&local_60);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    if (toUpper) {
      cmsys::SystemTools::UpperCase(&local_40,pbVar1 + 1);
    }
    else {
      cmsys::SystemTools::LowerCase(&local_40,pbVar1 + 1);
    }
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 2,local_60._M_dataplus._M_p)
    ;
  }
  std::__cxx11::string::~string((string *)&local_60);
  return 0x40 < uVar2;
}

Assistant:

bool cmStringCommand::HandleToUpperLowerCommand(
  std::vector<std::string> const& args, bool toUpper)
{
  if (args.size() < 3) {
    this->SetError("no output variable specified");
    return false;
  }

  std::string const& outvar = args[2];
  std::string output;

  if (toUpper) {
    output = cmSystemTools::UpperCase(args[1]);
  } else {
    output = cmSystemTools::LowerCase(args[1]);
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}